

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O3

void Ivy_ObjConnect(Ivy_Man_t *p,Ivy_Obj_t *pObj,Ivy_Obj_t *pFan0,Ivy_Obj_t *pFan1)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x98,"void Ivy_ObjConnect(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
  if (((7 < uVar1) || ((0x8eU >> uVar1 & 1) == 0)) && (pFan1 == (Ivy_Obj_t *)0x0 && uVar1 != 4)) {
    __assert_fail("Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || pFan1 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x99,"void Ivy_ObjConnect(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  pObj->pFanin0 = pFan0;
  pObj->pFanin1 = pFan1;
  pIVar2 = (Ivy_Obj_t *)((ulong)pFan0 & 0xfffffffffffffffe);
  if ((pIVar2 != (Ivy_Obj_t *)0x0) && (pIVar2->nRefs = pIVar2->nRefs + 1, p->fFanout != 0)) {
    Ivy_ObjAddFanout(p,pIVar2,pObj);
    pFan1 = pObj->pFanin1;
  }
  pIVar2 = (Ivy_Obj_t *)((ulong)pFan1 & 0xfffffffffffffffe);
  if ((pIVar2 != (Ivy_Obj_t *)0x0) && (pIVar2->nRefs = pIVar2->nRefs + 1, p->fFanout != 0)) {
    Ivy_ObjAddFanout(p,pIVar2,pObj);
  }
  Ivy_TableInsert(p,pObj);
  return;
}

Assistant:

void Ivy_ObjConnect( Ivy_Man_t * p, Ivy_Obj_t * pObj, Ivy_Obj_t * pFan0, Ivy_Obj_t * pFan1 )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || pFan1 != NULL );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( Ivy_ObjFanin0(pObj) != NULL )
    {
        Ivy_ObjRefsInc( Ivy_ObjFanin0(pObj) );
        if ( p->fFanout )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin0(pObj), pObj );
    }
    if ( Ivy_ObjFanin1(pObj) != NULL )
    {
        Ivy_ObjRefsInc( Ivy_ObjFanin1(pObj) );
        if ( p->fFanout )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
    // add the node to the structural hash table
    Ivy_TableInsert( p, pObj );
}